

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Cluster::QueueOrWriteFrame(Cluster *this,Frame *frame)

{
  const_iterator __position;
  bool bVar1;
  Frame *this_00;
  mapped_type *__k;
  Frame *frame_00;
  _Self *p_Var2;
  reference ppFVar3;
  pointer ppVar4;
  reference ppFVar5;
  Frame *pFVar6;
  reference __x;
  Frame *in_RSI;
  long in_RDI;
  Cluster *this_01;
  iterator iterator;
  bool wrote_frame;
  FrameMapIterator track_iterator;
  bool okay_to_write;
  Frame *frame_to_write;
  iterator end;
  iterator current_track_iterator;
  vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
  frames_to_erase;
  Frame *frame_to_store;
  uint64_t track_number;
  Frame *in_stack_fffffffffffffef8;
  Frame *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  Frame *in_stack_ffffffffffffff10;
  Frame *in_stack_ffffffffffffff20;
  Cluster *in_stack_ffffffffffffff28;
  key_type *in_stack_ffffffffffffff38;
  _List_const_iterator<mkvmuxer::Frame_*> local_a8;
  _List_iterator<mkvmuxer::Frame_*> *local_a0;
  __normal_iterator<std::_List_iterator<mkvmuxer::Frame_*>_*,_std::vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>_>
  local_98;
  undefined4 local_90;
  byte local_89;
  _Self local_88;
  _Self local_80;
  byte local_71;
  Frame *local_70;
  _List_iterator<mkvmuxer::Frame_*> local_68;
  _Self local_60;
  _Self local_58 [6];
  Frame *local_28;
  uint64_t local_20;
  Frame *local_18;
  byte local_1;
  
  if ((in_RSI == (Frame *)0x0) ||
     (local_18 = in_RSI, bVar1 = Frame::IsValid(in_stack_fffffffffffffef8), !bVar1)) {
    local_1 = 0;
  }
  else if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
    local_1 = DoWriteFrame(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  }
  else {
    local_20 = Frame::track_number(local_18);
    this_00 = (Frame *)operator_new(0x68);
    Frame::Frame(this_00);
    local_28 = this_00;
    Frame::CopyFrom((Frame *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    this_01 = (Cluster *)(in_RDI + 0x38);
    std::
    map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
    ::operator[]((map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                  *)this_00,in_stack_ffffffffffffff38);
    std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::push_back
              ((list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)
               in_stack_ffffffffffffff10,
               (value_type *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    std::
    vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
    ::vector((vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
              *)0x1819a8);
    __k = std::
          map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
          ::operator[]((map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                        *)this_00,in_stack_ffffffffffffff38);
    local_58[0]._M_node =
         (_List_node_base *)
         std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::begin
                   ((list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)
                    in_stack_fffffffffffffef8);
    frame_00 = (Frame *)std::
                        map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                        ::operator[]((map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                                      *)this_00,(key_type *)__k);
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::end
                   ((list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)
                    in_stack_fffffffffffffef8);
    p_Var2 = std::_List_iterator<mkvmuxer::Frame_*>::operator--(&local_68);
    local_60._M_node = p_Var2->_M_node;
    while (bVar1 = std::operator!=(local_58,&local_60), bVar1) {
      ppFVar3 = std::_List_iterator<mkvmuxer::Frame_*>::operator*
                          ((_List_iterator<mkvmuxer::Frame_*> *)0x181a42);
      local_70 = *ppFVar3;
      local_71 = 1;
      local_80._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
           ::begin((map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                    *)in_stack_fffffffffffffef8);
      while( true ) {
        local_88._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
             ::end((map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                    *)in_stack_fffffffffffffef8);
        bVar1 = std::operator!=(&local_80,&local_88);
        if (!bVar1) break;
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                               *)0x181aac);
        if (ppVar4->first != local_20) {
          std::
          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                        *)0x181b14);
          ppFVar5 = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::front
                              ((list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)
                               in_stack_ffffffffffffff00);
          pFVar6 = (Frame *)Frame::timestamp(*ppFVar5);
          in_stack_ffffffffffffff10 = (Frame *)Frame::timestamp(local_70);
          if (pFVar6 < in_stack_ffffffffffffff10) {
            local_71 = 0;
            break;
          }
        }
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                      *)in_stack_ffffffffffffff00);
      }
      if ((local_71 & 1) == 0) break;
      in_stack_ffffffffffffff0f = DoWriteFrame(this_01,frame_00);
      in_stack_ffffffffffffff00 = local_70;
      local_89 = in_stack_ffffffffffffff0f;
      if (local_70 != (Frame *)0x0) {
        Frame::~Frame(in_stack_ffffffffffffff10);
        operator_delete(in_stack_ffffffffffffff00);
      }
      if ((local_89 & 1) == 0) {
        local_1 = 0;
        goto LAB_00181ca9;
      }
      std::
      vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
      ::push_back((vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                   *)in_stack_ffffffffffffff10,
                  (value_type *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      std::_List_iterator<mkvmuxer::Frame_*>::operator++(local_58);
    }
    local_98._M_current =
         (_List_iterator<mkvmuxer::Frame_*> *)
         std::
         vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
         ::begin((vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                  *)in_stack_fffffffffffffef8);
    while( true ) {
      local_a0 = (_List_iterator<mkvmuxer::Frame_*> *)
                 std::
                 vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                 ::end((vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                        *)in_stack_fffffffffffffef8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::_List_iterator<mkvmuxer::Frame_*>_*,_std::vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>_>
                          *)in_stack_ffffffffffffff00,
                         (__normal_iterator<std::_List_iterator<mkvmuxer::Frame_*>_*,_std::vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>_>
                          *)in_stack_fffffffffffffef8);
      if (!bVar1) break;
      in_stack_fffffffffffffef8 =
           (Frame *)std::
                    map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                    ::operator[]((map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                                  *)this_00,(key_type *)__k);
      __x = __gnu_cxx::
            __normal_iterator<std::_List_iterator<mkvmuxer::Frame_*>_*,_std::vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>_>
            ::operator*(&local_98);
      std::_List_const_iterator<mkvmuxer::Frame_*>::_List_const_iterator(&local_a8,__x);
      __position._M_node._7_1_ = in_stack_ffffffffffffff0f;
      __position._M_node._0_7_ = in_stack_ffffffffffffff08;
      std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::erase
                ((list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)
                 in_stack_ffffffffffffff00,__position);
      __gnu_cxx::
      __normal_iterator<std::_List_iterator<mkvmuxer::Frame_*>_*,_std::vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>_>
      ::operator++(&local_98);
    }
    local_1 = 1;
LAB_00181ca9:
    local_90 = 1;
    std::
    vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
    ::~vector((vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
               *)in_stack_ffffffffffffff10);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Cluster::QueueOrWriteFrame(const Frame* const frame) {
  if (!frame || !frame->IsValid())
    return false;

  // If |write_last_frame_with_duration_| is not set, then write the frame right
  // away.
  if (!write_last_frame_with_duration_) {
    return DoWriteFrame(frame);
  }

  // Queue the current frame.
  uint64_t track_number = frame->track_number();
  Frame* const frame_to_store = new Frame();
  frame_to_store->CopyFrom(*frame);
  stored_frames_[track_number].push_back(frame_to_store);

  // Iterate through all queued frames in the current track except the last one
  // and write it if it is okay to do so (i.e.) no other track has an held back
  // frame with timestamp <= the timestamp of the frame in question.
  std::vector<std::list<Frame*>::iterator> frames_to_erase;
  for (std::list<Frame*>::iterator
           current_track_iterator = stored_frames_[track_number].begin(),
           end = --stored_frames_[track_number].end();
       current_track_iterator != end; ++current_track_iterator) {
    const Frame* const frame_to_write = *current_track_iterator;
    bool okay_to_write = true;
    for (FrameMapIterator track_iterator = stored_frames_.begin();
         track_iterator != stored_frames_.end(); ++track_iterator) {
      if (track_iterator->first == track_number) {
        continue;
      }
      if (track_iterator->second.front()->timestamp() <
          frame_to_write->timestamp()) {
        okay_to_write = false;
        break;
      }
    }
    if (okay_to_write) {
      const bool wrote_frame = DoWriteFrame(frame_to_write);
      delete frame_to_write;
      if (!wrote_frame)
        return false;
      frames_to_erase.push_back(current_track_iterator);
    } else {
      break;
    }
  }
  for (std::vector<std::list<Frame*>::iterator>::iterator iterator =
           frames_to_erase.begin();
       iterator != frames_to_erase.end(); ++iterator) {
    stored_frames_[track_number].erase(*iterator);
  }
  return true;
}